

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O0

bool __thiscall ProStringList::contains(ProStringList *this,QString *str,CaseSensitivity cs)

{
  byte bVar1;
  undefined4 in_EDX;
  ProStringList *in_RSI;
  ProString *in_RDI;
  long in_FS_OFFSET;
  QString *in_stack_ffffffffffffff98;
  CaseSensitivity cs_00;
  undefined4 in_stack_ffffffffffffffb0;
  undefined1 local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  cs_00 = (CaseSensitivity)((ulong)local_38 >> 0x20);
  ProString::ProString(in_RDI,in_stack_ffffffffffffff98);
  bVar1 = contains(in_RSI,(ProString *)CONCAT44(in_EDX,in_stack_ffffffffffffffb0),cs_00);
  ProString::~ProString((ProString *)0x134cf3);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool contains(const QString &str, Qt::CaseSensitivity cs = Qt::CaseSensitive) const
        { return contains(ProString(str), cs); }